

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,measurement *measure,uint64_t match_flags)

{
  byte bVar1;
  precise_unit *un;
  string str;
  stringstream ss;
  string local_1d0;
  double local_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  long local_1a0;
  undefined8 uStack_198;
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a0 + -0x18)) = 6;
  std::ostream::_M_insert<double>(*(double *)this);
  local_1a8 = *(undefined4 *)(this + 0xc);
  local_1b0 = (double)*(float *)(this + 8);
  local_1a4 = 0;
  to_string_abi_cxx11_(&local_1d0,(units *)&local_1b0,un,match_flags);
  if (local_1d0._M_string_length != 0) {
    local_1b0 = (double)CONCAT71(local_1b0._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)&local_1b0,1);
    bVar1 = *local_1d0._M_dataplus._M_p;
    if (((byte)(bVar1 - 0x30) < 10) ||
       ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)))) {
      std::__cxx11::string::_M_replace_aux((ulong)&local_1d0,0,0,'\x01');
      std::__cxx11::string::push_back((char)&local_1d0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const measurement& measure, std::uint64_t match_flags)
{
    std::stringstream ss;
    ss.precision(6);
    ss << measure.value();

    auto str = to_string(measure.units(), match_flags);
    if (!str.empty()) {
        ss << ' ';
        if (isNumericalStartCharacter(str.front())) {
            str.insert(str.begin(), '(');
            str.push_back(')');
        }
        ss << str;
    }
    return ss.str();
}